

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O3

void decode_token_recon_block(AV1Decoder *pbi,ThreadData *td,aom_reader *r,BLOCK_SIZE bsize)

{
  macroblockd_plane *pmVar1;
  AV1_COMMON *cm;
  BLOCK_SIZE plane_bsize;
  int iVar2;
  MB_MODE_INFO *pMVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  byte bVar8;
  byte bVar9;
  ushort uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  macroblockd_plane *pmVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  int block;
  int plane;
  uint uVar24;
  int eobtotal;
  AV1Decoder *local_40;
  ulong local_38;
  
  cm = &pbi->common;
  uVar16 = (uint)(((pbi->common).seq_params)->monochrome == '\0') * 2 + 1;
  pMVar3 = *(td->dcb).xd.mi;
  local_40 = pbi;
  if (((pMVar3->field_0xa7 & 0x80) == 0) && (pMVar3->ref_frame[0] < '\x01')) {
    uVar12 = (uint)block_size_wide[bsize];
    iVar17 = (td->dcb).xd.mb_to_right_edge;
    if (iVar17 < 0) {
      uVar12 = (uint)block_size_wide[bsize] +
               (iVar17 >> ((char)(td->dcb).xd.plane[0].subsampling_x + 3U & 0x1f));
    }
    uVar12 = (int)uVar12 >> 2;
    uVar18 = (uint)block_size_high[bsize];
    iVar17 = (td->dcb).xd.mb_to_bottom_edge;
    if (iVar17 < 0) {
      uVar18 = (uint)block_size_high[bsize] +
               (iVar17 >> ((char)(td->dcb).xd.plane[0].subsampling_y + 3U & 0x1f));
    }
    uVar18 = (int)uVar18 >> 2;
    uVar11 = 0x10;
    if ((int)uVar12 < 0x10) {
      uVar11 = uVar12;
    }
    uVar23 = 0x10;
    if ((int)uVar18 < 0x10) {
      uVar23 = uVar18;
    }
    if (0 < (int)uVar18) {
      pmVar1 = (td->dcb).xd.plane;
      uVar4 = 0;
      do {
        uVar7 = uVar23 + uVar4;
        if (0 < (int)uVar12) {
          uVar5 = uVar18;
          if ((int)uVar7 < (int)uVar18) {
            uVar5 = uVar7;
          }
          uVar13 = 0;
          do {
            uVar19 = uVar11 + uVar13;
            uVar6 = uVar12;
            if ((int)uVar19 < (int)uVar12) {
              uVar6 = uVar19;
            }
            uVar20 = 0;
            do {
              if (uVar20 == 0) {
                pMVar3 = *(td->dcb).xd.mi;
                pmVar15 = pmVar1;
                if ((td->dcb).xd.lossless[*(ushort *)&pMVar3->field_0xa7 & 7] == 0) {
                  uVar24 = (uint)pMVar3->tx_size;
                }
                else {
                  uVar24 = 0;
                }
              }
              else {
                if ((td->dcb).xd.is_chroma_ref != true) break;
                pmVar15 = pmVar1 + uVar20;
                pMVar3 = *(td->dcb).xd.mi;
                if ((td->dcb).xd.lossless[*(ushort *)&pMVar3->field_0xa7 & 7] == 0) {
                  bVar8 = ""[av1_ss_size_lookup[pMVar3->bsize][pmVar15->subsampling_x]
                             [pmVar15->subsampling_y]];
                  uVar24 = (uint)bVar8;
                  if (bVar8 < 0x11) {
                    if ((bVar8 - 0xb < 2) || (bVar8 == 4)) {
                      uVar24 = 3;
                    }
                  }
                  else if (bVar8 == 0x11) {
                    uVar24 = 9;
                  }
                  else if (bVar8 == 0x12) {
                    uVar24 = 10;
                  }
                }
                else {
                  uVar24 = 0;
                }
              }
              bVar8 = (byte)pmVar15->subsampling_y;
              bVar9 = (byte)pmVar15->subsampling_x;
              iVar17 = (int)(((1 << (bVar8 & 0x1f)) >> 1) + uVar5) >> (bVar8 & 0x1f);
              uVar14 = uVar4 >> (bVar8 & 0x1f);
              if ((int)uVar14 < iVar17) {
                iVar21 = *(int *)((long)tx_size_high_unit + (ulong)(uVar24 << 2));
                iVar2 = *(int *)((long)tx_size_wide_unit + (ulong)(uVar24 << 2));
                do {
                  for (uVar22 = uVar13 >> ((byte)pmVar15->subsampling_x & 0x1f);
                      (int)uVar22 < (int)(((1 << (bVar9 & 0x1f)) >> 1) + uVar6) >> (bVar9 & 0x1f);
                      uVar22 = uVar22 + iVar2) {
                    (*td->read_coeffs_tx_intra_block_visit)
                              (cm,&td->dcb,r,(int)uVar20,uVar14,uVar22,(TX_SIZE)uVar24);
                    (*td->predict_and_recon_intra_block_visit)
                              (cm,&td->dcb,r,(int)uVar20,uVar14,uVar22,(TX_SIZE)uVar24);
                    uVar10 = (short)*(undefined4 *)((long)tx_size_high + (ulong)(uVar24 * 4)) *
                             (short)*(undefined4 *)((long)tx_size_wide + (ulong)(uVar24 * 4)) +
                             (td->dcb).cb_offset[uVar20];
                    (td->dcb).cb_offset[uVar20] = uVar10;
                    (td->dcb).txb_offset[uVar20] = uVar10 >> 4;
                  }
                  uVar14 = uVar14 + iVar21;
                } while ((int)uVar14 < iVar17);
              }
              uVar20 = uVar20 + 1;
            } while (uVar20 != uVar16);
            uVar13 = uVar19;
          } while ((int)uVar19 < (int)uVar12);
        }
        uVar4 = uVar7;
      } while ((int)uVar7 < (int)uVar18);
    }
  }
  else {
    (*td->predict_inter_block_visit)(cm,&td->dcb,bsize);
    if (pMVar3->skip_txfm == '\0') {
      eobtotal = 0;
      uVar12 = (uint)block_size_wide[bsize];
      iVar17 = (td->dcb).xd.mb_to_right_edge;
      if (iVar17 < 0) {
        uVar12 = (uint)block_size_wide[bsize] +
                 (iVar17 >> ((char)(td->dcb).xd.plane[0].subsampling_x + 3U & 0x1f));
      }
      uVar12 = (int)uVar12 >> 2;
      uVar18 = (uint)block_size_high[bsize];
      iVar17 = (td->dcb).xd.mb_to_bottom_edge;
      if (iVar17 < 0) {
        uVar18 = (uint)block_size_high[bsize] +
                 (iVar17 >> ((char)(td->dcb).xd.plane[0].subsampling_y + 3U & 0x1f));
      }
      uVar18 = (int)uVar18 >> 2;
      uVar11 = 0x10;
      if ((int)uVar12 < 0x10) {
        uVar11 = uVar12;
      }
      uVar23 = 0x10;
      if ((int)uVar18 < 0x10) {
        uVar23 = uVar18;
      }
      local_38 = (ulong)uVar23;
      if (0 < (int)uVar18) {
        uVar23 = 0;
        do {
          uVar4 = (int)local_38 + uVar23;
          if (0 < (int)uVar12) {
            uVar7 = uVar18;
            if ((int)uVar4 < (int)uVar18) {
              uVar7 = uVar4;
            }
            uVar5 = 0;
            do {
              uVar6 = uVar11 + uVar5;
              uVar13 = uVar12;
              if ((int)uVar6 < (int)uVar12) {
                uVar13 = uVar6;
              }
              uVar20 = 0;
              do {
                if ((uVar20 != 0) && ((td->dcb).xd.is_chroma_ref != true)) break;
                iVar17 = (td->dcb).xd.plane[uVar20].subsampling_x;
                iVar21 = (td->dcb).xd.plane[uVar20].subsampling_y;
                plane_bsize = av1_ss_size_lookup[bsize][iVar17][iVar21];
                uVar19 = 0;
                if ((td->dcb).xd.lossless[*(ushort *)&(*(td->dcb).xd.mi)->field_0xa7 & 7] == 0) {
                  bVar8 = ""[plane_bsize];
                  if (uVar20 == 0) {
LAB_0017fae8:
                    bVar9 = bVar8;
                  }
                  else if (bVar8 < 0x11) {
                    bVar9 = 3;
                    if ((1 < bVar8 - 0xb) && (bVar8 != 4)) goto LAB_0017fae8;
                  }
                  else if (bVar8 == 0x11) {
                    bVar9 = 9;
                  }
                  else {
                    if (bVar8 != 0x12) goto LAB_0017fae8;
                    bVar9 = 10;
                  }
                  uVar19 = (uint)bVar9;
                }
                bVar8 = (byte)iVar21;
                iVar21 = (int)(((1 << (bVar8 & 0x1f)) >> 1) + uVar7) >> (bVar8 & 0x1f);
                bVar9 = (byte)iVar17;
                uVar24 = uVar23 >> (bVar8 & 0x1f);
                if ((int)uVar24 < iVar21) {
                  iVar17 = *(int *)((long)tx_size_high_unit + (ulong)(uVar19 << 2));
                  iVar2 = *(int *)((long)tx_size_wide_unit + (ulong)(uVar19 << 2));
                  uVar22 = uVar5 >> (bVar9 & 0x1f);
                  block = 0;
                  uVar14 = uVar22;
                  do {
                    for (; (int)uVar14 <
                           (int)(((1 << (bVar9 & 0x1f)) >> 1) + uVar13) >> (bVar9 & 0x1f);
                        uVar14 = uVar14 + iVar2) {
                      decode_reconstruct_tx
                                (cm,td,r,pMVar3,(int)uVar20,plane_bsize,uVar24,uVar14,block,
                                 (TX_SIZE)uVar19,&eobtotal);
                      block = block + iVar2 * iVar17;
                    }
                    uVar24 = uVar24 + iVar17;
                    uVar14 = uVar22;
                  } while ((int)uVar24 < iVar21);
                }
                uVar20 = uVar20 + 1;
              } while (uVar20 != uVar16);
              uVar5 = uVar6;
            } while ((int)uVar6 < (int)uVar12);
          }
          uVar23 = uVar4;
        } while ((int)uVar4 < (int)uVar18);
      }
    }
    (*td->cfl_store_inter_block_visit)(cm,(MACROBLOCKD *)td);
  }
  av1_visit_palette(local_40,(MACROBLOCKD *)td,r,set_color_index_map_offset);
  return;
}

Assistant:

static inline void decode_token_recon_block(AV1Decoder *const pbi,
                                            ThreadData *const td, aom_reader *r,
                                            BLOCK_SIZE bsize) {
  AV1_COMMON *const cm = &pbi->common;
  DecoderCodingBlock *const dcb = &td->dcb;
  MACROBLOCKD *const xd = &dcb->xd;
  const int num_planes = av1_num_planes(cm);
  MB_MODE_INFO *mbmi = xd->mi[0];

  if (!is_inter_block(mbmi)) {
    int row, col;
    assert(bsize == get_plane_block_size(bsize, xd->plane[0].subsampling_x,
                                         xd->plane[0].subsampling_y));
    const int max_blocks_wide = max_block_wide(xd, bsize, 0);
    const int max_blocks_high = max_block_high(xd, bsize, 0);
    const BLOCK_SIZE max_unit_bsize = BLOCK_64X64;
    int mu_blocks_wide = mi_size_wide[max_unit_bsize];
    int mu_blocks_high = mi_size_high[max_unit_bsize];
    mu_blocks_wide = AOMMIN(max_blocks_wide, mu_blocks_wide);
    mu_blocks_high = AOMMIN(max_blocks_high, mu_blocks_high);

    for (row = 0; row < max_blocks_high; row += mu_blocks_high) {
      for (col = 0; col < max_blocks_wide; col += mu_blocks_wide) {
        for (int plane = 0; plane < num_planes; ++plane) {
          if (plane && !xd->is_chroma_ref) break;
          const struct macroblockd_plane *const pd = &xd->plane[plane];
          const TX_SIZE tx_size = av1_get_tx_size(plane, xd);
          const int stepr = tx_size_high_unit[tx_size];
          const int stepc = tx_size_wide_unit[tx_size];

          const int unit_height = ROUND_POWER_OF_TWO(
              AOMMIN(mu_blocks_high + row, max_blocks_high), pd->subsampling_y);
          const int unit_width = ROUND_POWER_OF_TWO(
              AOMMIN(mu_blocks_wide + col, max_blocks_wide), pd->subsampling_x);

          for (int blk_row = row >> pd->subsampling_y; blk_row < unit_height;
               blk_row += stepr) {
            for (int blk_col = col >> pd->subsampling_x; blk_col < unit_width;
                 blk_col += stepc) {
              td->read_coeffs_tx_intra_block_visit(cm, dcb, r, plane, blk_row,
                                                   blk_col, tx_size);
              td->predict_and_recon_intra_block_visit(
                  cm, dcb, r, plane, blk_row, blk_col, tx_size);
              set_cb_buffer_offsets(dcb, tx_size, plane);
            }
          }
        }
      }
    }
  } else {
    td->predict_inter_block_visit(cm, dcb, bsize);
    // Reconstruction
    if (!mbmi->skip_txfm) {
      int eobtotal = 0;

      const int max_blocks_wide = max_block_wide(xd, bsize, 0);
      const int max_blocks_high = max_block_high(xd, bsize, 0);
      int row, col;

      const BLOCK_SIZE max_unit_bsize = BLOCK_64X64;
      assert(max_unit_bsize ==
             get_plane_block_size(BLOCK_64X64, xd->plane[0].subsampling_x,
                                  xd->plane[0].subsampling_y));
      int mu_blocks_wide = mi_size_wide[max_unit_bsize];
      int mu_blocks_high = mi_size_high[max_unit_bsize];

      mu_blocks_wide = AOMMIN(max_blocks_wide, mu_blocks_wide);
      mu_blocks_high = AOMMIN(max_blocks_high, mu_blocks_high);

      for (row = 0; row < max_blocks_high; row += mu_blocks_high) {
        for (col = 0; col < max_blocks_wide; col += mu_blocks_wide) {
          for (int plane = 0; plane < num_planes; ++plane) {
            if (plane && !xd->is_chroma_ref) break;
            const struct macroblockd_plane *const pd = &xd->plane[plane];
            const int ss_x = pd->subsampling_x;
            const int ss_y = pd->subsampling_y;
            const BLOCK_SIZE plane_bsize =
                get_plane_block_size(bsize, ss_x, ss_y);
            const TX_SIZE max_tx_size =
                get_vartx_max_txsize(xd, plane_bsize, plane);
            const int bh_var_tx = tx_size_high_unit[max_tx_size];
            const int bw_var_tx = tx_size_wide_unit[max_tx_size];
            int block = 0;
            int step =
                tx_size_wide_unit[max_tx_size] * tx_size_high_unit[max_tx_size];
            int blk_row, blk_col;
            const int unit_height = ROUND_POWER_OF_TWO(
                AOMMIN(mu_blocks_high + row, max_blocks_high), ss_y);
            const int unit_width = ROUND_POWER_OF_TWO(
                AOMMIN(mu_blocks_wide + col, max_blocks_wide), ss_x);

            for (blk_row = row >> ss_y; blk_row < unit_height;
                 blk_row += bh_var_tx) {
              for (blk_col = col >> ss_x; blk_col < unit_width;
                   blk_col += bw_var_tx) {
                decode_reconstruct_tx(cm, td, r, mbmi, plane, plane_bsize,
                                      blk_row, blk_col, block, max_tx_size,
                                      &eobtotal);
                block += step;
              }
            }
          }
        }
      }
    }
    td->cfl_store_inter_block_visit(cm, xd);
  }

  av1_visit_palette(pbi, xd, r, set_color_index_map_offset);
}